

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O0

void Vec_WecSortByFirstInt(Vec_Wec_t *p,int fReverse)

{
  int fReverse_local;
  Vec_Wec_t *p_local;
  
  if (fReverse == 0) {
    qsort(p->pArray,(long)p->nSize,0x10,Vec_WecSortCompare3);
  }
  else {
    qsort(p->pArray,(long)p->nSize,0x10,Vec_WecSortCompare4);
  }
  return;
}

Assistant:

static inline void Vec_WecSortByFirstInt( Vec_Wec_t * p, int fReverse )
{
    if ( fReverse ) 
        qsort( (void *)p->pArray, (size_t)p->nSize, sizeof(Vec_Int_t), 
                (int (*)(const void *, const void *)) Vec_WecSortCompare4 );
    else
        qsort( (void *)p->pArray, (size_t)p->nSize, sizeof(Vec_Int_t), 
                (int (*)(const void *, const void *)) Vec_WecSortCompare3 );
}